

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QWidget*,QList<QGesture*>>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QWidget_*,_QList<QGesture_*>_> *c)

{
  QDebug debug_00;
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  Stream *local_70;
  undefined1 local_68 [8];
  undefined1 local_60 [16];
  piter local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,"(");
  local_50 = (piter)QHash<QWidget_*,_QList<QGesture_*>_>::constBegin(c);
  debug_00.stream = (Stream *)(local_60 + 8);
  while ((local_50.d != (Data<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_> *)0x0 ||
         (local_50.bucket != 0))) {
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,'(');
    local_70 = pQVar3->stream;
    *(int *)(local_70 + 0x28) = *(int *)(local_70 + 0x28) + 1;
    ::operator<<((Stream *)local_68,(QWidget *)&local_70);
    pQVar3 = QDebug::operator<<((QDebug *)local_68,", ");
    local_60._0_8_ = pQVar3->stream;
    *(int *)(local_60._0_8_ + 0x28) = *(int *)(local_60._0_8_ + 0x28) + 1;
    ::operator<<(debug_00,(QList<QGesture_*> *)local_60);
    QDebug::operator<<((QDebug *)debug_00.stream,')');
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)local_68);
    QDebug::~QDebug((QDebug *)&local_70);
    QHashPrivate::iterator<QHashPrivate::Node<QWidget_*,_QList<QGesture_*>_>_>::operator++
              (&local_50);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar2 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}